

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeFinalizing.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_35::TypeFinalizing::run(TypeFinalizing *this,Module *module)

{
  bool bVar1;
  reference pHVar2;
  SubTypes *this_00;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_01;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_1a8;
  TypeRewriter local_190;
  _Node_iterator_base<wasm::HeapType,_true> local_120;
  undefined1 local_118;
  uintptr_t local_110;
  HeapType local_108;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> privateTypes;
  SubTypes local_c0;
  undefined1 local_70 [8];
  optional<wasm::SubTypes> subTypes;
  Module *module_local;
  TypeFinalizing *this_local;
  
  subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
  super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
  super__Optional_payload_base<wasm::SubTypes>._80_8_ = module;
  bVar1 = FeatureSet::hasGC(&module->features);
  if (bVar1) {
    std::optional<wasm::SubTypes>::optional((optional<wasm::SubTypes> *)local_70);
    if ((this->finalize & 1U) != 0) {
      SubTypes::SubTypes(&local_c0,
                         (Module *)
                         subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                         super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                         super__Optional_payload_base<wasm::SubTypes>._80_8_);
      std::optional<wasm::SubTypes>::operator=((optional<wasm::SubTypes> *)local_70,&local_c0);
      SubTypes::~SubTypes(&local_c0);
    }
    wasm::ModuleUtils::getPrivateHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2,
               (Module *)
               subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
               super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
               super__Optional_payload_base<wasm::SubTypes>._80_8_);
    __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    type.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&type), bVar1) {
      pHVar2 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2);
      local_108.id = pHVar2->id;
      if ((this->finalize & 1U) == 0) {
LAB_022e901d:
        pVar3 = std::
                unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                ::insert(&this->modifiableTypes,&local_108);
        local_120._M_cur =
             (__node_type *)pVar3.first.super__Node_iterator_base<wasm::HeapType,_true>._M_cur;
        local_118 = pVar3.second;
      }
      else {
        this_00 = std::optional<wasm::SubTypes>::operator->((optional<wasm::SubTypes> *)local_70);
        local_110 = local_108.id;
        this_01 = SubTypes::getImmediateSubTypes(this_00,local_108);
        bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(this_01);
        if (bVar1) goto LAB_022e901d;
      }
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2);
    }
    wasm::(anonymous_namespace)::TypeFinalizing::run(wasm::Module*)::TypeRewriter::TypeRewriter(wasm
    ::Module&,wasm::(anonymous)::TypeFinalizing__
              (&local_190,
               (Module *)
               subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
               super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
               super__Optional_payload_base<wasm::SubTypes>._80_8_,this);
    local_1a8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_1a8);
    GlobalTypeRewriter::update(&local_190.super_GlobalTypeRewriter,&local_1a8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_1a8);
    run::TypeRewriter::~TypeRewriter(&local_190);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    std::optional<wasm::SubTypes>::~optional((optional<wasm::SubTypes> *)local_70);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // To make a type final, it must have no subtypes.
    std::optional<SubTypes> subTypes;
    if (finalize) {
      subTypes = SubTypes(*module);
    }

    auto privateTypes = ModuleUtils::getPrivateHeapTypes(*module);
    for (auto type : privateTypes) {
      // If we are finalizing types then we can only do that to leaf types. If
      // we are unfinalizing, we can do that unconditionally.
      if (!finalize || subTypes->getImmediateSubTypes(type).empty()) {
        modifiableTypes.insert(type);
      }
    }

    class TypeRewriter : public GlobalTypeRewriter {
      TypeFinalizing& parent;

    public:
      TypeRewriter(Module& wasm, TypeFinalizing& parent)
        : GlobalTypeRewriter(wasm), parent(parent) {}

      void modifyTypeBuilderEntry(TypeBuilder& typeBuilder,
                                  Index i,
                                  HeapType oldType) override {
        if (parent.modifiableTypes.count(oldType)) {
          typeBuilder[i].setOpen(!parent.finalize);
        }
      }
    };

    TypeRewriter(*module, *this).update();
  }